

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caniter.cpp
# Opt level: O0

void __thiscall
icu_63::CanonicalIterator::setSource
          (CanonicalIterator *this,UnicodeString *newSource,UErrorCode *status)

{
  undefined1 auVar1 [16];
  UBool UVar2;
  int32_t iVar3;
  uint uVar4;
  UnicodeString **ppUVar5;
  int32_t *piVar6;
  undefined8 *puVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *puVar10;
  UnicodeString *pUVar11;
  UnicodeString *segment;
  UMemory *this_00;
  int iVar12;
  UnicodeString *local_120;
  UnicodeString *local_f8;
  UnicodeString *local_c0;
  UnicodeString *local_b0;
  UnicodeString *local_38;
  UnicodeString *list;
  int32_t i;
  int32_t start;
  UChar32 cp;
  int32_t list_length;
  UErrorCode *status_local;
  UnicodeString *newSource_local;
  CanonicalIterator *this_local;
  
  start = 0;
  list._4_4_ = 0;
  local_38 = (UnicodeString *)0x0;
  segment = newSource;
  (*(this->nfd->super_UObject)._vptr_UObject[3])(this->nfd,newSource,&this->source,status);
  UVar2 = ::U_FAILURE(*status);
  if (UVar2 == '\0') {
    this->done = '\0';
    cleanPieces(this);
    iVar3 = UnicodeString::length(newSource);
    if (iVar3 == 0) {
      ppUVar5 = (UnicodeString **)uprv_malloc_63(8);
      this->pieces = ppUVar5;
      piVar6 = (int32_t *)uprv_malloc_63(4);
      this->pieces_lengths = piVar6;
      this->pieces_length = 1;
      piVar6 = (int32_t *)uprv_malloc_63(4);
      this->current = piVar6;
      this->current_length = 1;
      if (((this->pieces == (UnicodeString **)0x0) || (this->pieces_lengths == (int32_t *)0x0)) ||
         (this->current == (int32_t *)0x0)) {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        *this->current = 0;
        puVar7 = (undefined8 *)UMemory::operator_new__((UMemory *)0x48,(size_t)segment);
        local_b0 = (UnicodeString *)0x0;
        if (puVar7 != (undefined8 *)0x0) {
          *puVar7 = 1;
          local_b0 = (UnicodeString *)(puVar7 + 1);
          local_c0 = local_b0;
          do {
            UnicodeString::UnicodeString(local_c0);
            local_c0 = local_c0 + 1;
          } while (local_c0 != (UnicodeString *)(puVar7 + 9));
        }
        *this->pieces = local_b0;
        *this->pieces_lengths = 1;
        if (*this->pieces != (UnicodeString *)0x0) {
          return;
        }
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
    }
    else {
      iVar3 = UnicodeString::length(&this->source);
      uVar8 = (ulong)iVar3;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar8;
      uVar9 = SUB168(auVar1 * ZEXT816(0x40),0);
      this_00 = (UMemory *)(uVar9 + 8);
      if (SUB168(auVar1 * ZEXT816(0x40),8) != 0 || 0xfffffffffffffff7 < uVar9) {
        this_00 = (UMemory *)0xffffffffffffffff;
      }
      puVar10 = (ulong *)UMemory::operator_new__(this_00,(size_t)segment);
      local_f8 = (UnicodeString *)0x0;
      if (puVar10 != (ulong *)0x0) {
        *puVar10 = uVar8;
        local_f8 = (UnicodeString *)(puVar10 + 1);
        if (uVar8 != 0) {
          local_120 = local_f8;
          do {
            UnicodeString::UnicodeString(local_120);
            local_120 = local_120 + 1;
          } while (local_120 != local_f8 + uVar8);
        }
      }
      local_38 = local_f8;
      if (local_f8 == (UnicodeString *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        uVar4 = UnicodeString::char32At(&this->source,0);
        list._0_4_ = 2;
        if (uVar4 < 0x10000) {
          list._0_4_ = 1;
        }
        for (; iVar3 = UnicodeString::length(&this->source), (int)(uint)list < iVar3;
            list._0_4_ = iVar12 + (uint)list) {
          uVar4 = UnicodeString::char32At(&this->source,(uint)list);
          UVar2 = Normalizer2Impl::isCanonSegmentStarter(this->nfcImpl,uVar4);
          if (UVar2 != '\0') {
            UnicodeString::extract
                      (&this->source,list._4_4_,(uint)list - list._4_4_,local_f8 + start);
            list._4_4_ = (uint)list;
            start = start + 1;
          }
          iVar12 = 2;
          if (uVar4 < 0x10000) {
            iVar12 = 1;
          }
        }
        segment = (UnicodeString *)(ulong)list._4_4_;
        iVar12 = start + 1;
        UnicodeString::extract(&this->source,list._4_4_,(uint)list - list._4_4_,local_f8 + start);
        ppUVar5 = (UnicodeString **)uprv_malloc_63((long)iVar12 << 3);
        this->pieces = ppUVar5;
        this->pieces_length = iVar12;
        piVar6 = (int32_t *)uprv_malloc_63((long)iVar12 << 2);
        this->pieces_lengths = piVar6;
        piVar6 = (int32_t *)uprv_malloc_63((long)iVar12 << 2);
        this->current = piVar6;
        this->current_length = iVar12;
        if (((this->pieces != (UnicodeString **)0x0) && (this->pieces_lengths != (int32_t *)0x0)) &&
           (this->current != (int32_t *)0x0)) {
          for (list._0_4_ = 0; (int)(uint)list < this->current_length; list._0_4_ = (uint)list + 1)
          {
            this->current[(int)(uint)list] = 0;
          }
          for (list._0_4_ = 0; (int)(uint)list < this->pieces_length; list._0_4_ = (uint)list + 1) {
            segment = local_f8 + (int)(uint)list;
            pUVar11 = getEquivalents(this,segment,this->pieces_lengths + (int)(uint)list,status);
            this->pieces[(int)(uint)list] = pUVar11;
          }
          if (local_f8 == (UnicodeString *)0x0) {
            return;
          }
          pUVar11 = local_f8 + *(long *)((long)&local_f8[-1].fUnion + 0x30);
          while (local_f8 != pUVar11) {
            pUVar11 = pUVar11 + -1;
            UnicodeString::~UnicodeString(pUVar11);
          }
          UMemory::operator_delete__((UMemory *)((long)&local_f8[-1].fUnion + 0x30),segment);
          return;
        }
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
    }
    if ((local_38 != (UnicodeString *)0x0) && (local_38 != (UnicodeString *)0x0)) {
      pUVar11 = local_38 + *(long *)((long)&local_38[-1].fUnion + 0x30);
      while (local_38 != pUVar11) {
        pUVar11 = pUVar11 + -1;
        UnicodeString::~UnicodeString(pUVar11);
      }
      UMemory::operator_delete__((UMemory *)((long)&local_38[-1].fUnion + 0x30),segment);
    }
    cleanPieces(this);
  }
  return;
}

Assistant:

void CanonicalIterator::setSource(const UnicodeString &newSource, UErrorCode &status) {
    int32_t list_length = 0;
    UChar32 cp = 0;
    int32_t start = 0;
    int32_t i = 0;
    UnicodeString *list = NULL;

    nfd.normalize(newSource, source, status);
    if(U_FAILURE(status)) {
      return;
    }
    done = FALSE;

    cleanPieces();

    // catch degenerate case
    if (newSource.length() == 0) {
        pieces = (UnicodeString **)uprv_malloc(sizeof(UnicodeString *));
        pieces_lengths = (int32_t*)uprv_malloc(1 * sizeof(int32_t));
        pieces_length = 1;
        current = (int32_t*)uprv_malloc(1 * sizeof(int32_t));
        current_length = 1;
        if (pieces == NULL || pieces_lengths == NULL || current == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            goto CleanPartialInitialization;
        }
        current[0] = 0;
        pieces[0] = new UnicodeString[1];
        pieces_lengths[0] = 1;
        if (pieces[0] == 0) {
            status = U_MEMORY_ALLOCATION_ERROR;
            goto CleanPartialInitialization;
        }
        return;
    }


    list = new UnicodeString[source.length()];
    if (list == 0) {
        status = U_MEMORY_ALLOCATION_ERROR;
        goto CleanPartialInitialization;
    }

    // i should initialy be the number of code units at the 
    // start of the string
    i = U16_LENGTH(source.char32At(0));
    //int32_t i = 1;
    // find the segments
    // This code iterates through the source string and 
    // extracts segments that end up on a codepoint that
    // doesn't start any decompositions. (Analysis is done
    // on the NFD form - see above).
    for (; i < source.length(); i += U16_LENGTH(cp)) {
        cp = source.char32At(i);
        if (nfcImpl.isCanonSegmentStarter(cp)) {
            source.extract(start, i-start, list[list_length++]); // add up to i
            start = i;
        }
    }
    source.extract(start, i-start, list[list_length++]); // add last one


    // allocate the arrays, and find the strings that are CE to each segment
    pieces = (UnicodeString **)uprv_malloc(list_length * sizeof(UnicodeString *));
    pieces_length = list_length;
    pieces_lengths = (int32_t*)uprv_malloc(list_length * sizeof(int32_t));
    current = (int32_t*)uprv_malloc(list_length * sizeof(int32_t));
    current_length = list_length;
    if (pieces == NULL || pieces_lengths == NULL || current == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
        goto CleanPartialInitialization;
    }

    for (i = 0; i < current_length; i++) {
        current[i] = 0;
    }
    // for each segment, get all the combinations that can produce 
    // it after NFD normalization
    for (i = 0; i < pieces_length; ++i) {
        //if (PROGRESS) printf("SEGMENT\n");
        pieces[i] = getEquivalents(list[i], pieces_lengths[i], status);
    }

    delete[] list;
    return;
// Common section to cleanup all local variables and reset object variables.
CleanPartialInitialization:
    if (list != NULL) {
        delete[] list;
    }
    cleanPieces();
}